

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::FileDescriptorProto::_InternalParse
          (FileDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  EnumDescriptorProto *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  DescriptorProto *msg_00;
  FileOptions *msg_01;
  ServiceDescriptorProto *msg_02;
  FieldDescriptorProto *msg_03;
  uint64 uVar2;
  SourceCodeInfo *msg_04;
  char cVar3;
  RepeatedField<int> *object;
  uint32 tag;
  char *local_68;
  uint local_5c;
  RepeatedField<int> *local_58;
  RepeatedField<int> *local_50;
  InternalMetadataWithArena *local_48;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *local_40;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *local_38;
  
  local_48 = &this->_internal_metadata_;
  local_50 = &this->weak_dependency_;
  local_58 = &this->public_dependency_;
  local_38 = &this->extension_;
  local_40 = &this->service_;
  local_68 = ptr;
LAB_002a9d61:
  do {
    bVar1 = internal::ParseContext::Done(ctx,&local_68);
    if (bVar1) {
      return local_68;
    }
    local_68 = internal::ReadTag(local_68,&local_5c,0);
    if (local_68 == (char *)0x0) {
      return (char *)0x0;
    }
    cVar3 = (char)local_5c;
    switch(local_5c >> 3) {
    case 1:
      if (cVar3 != '\n') break;
      s = _internal_mutable_name_abi_cxx11_(this);
LAB_002a9f42:
      local_68 = internal::InlineGreedyStringParser(s,local_68,ctx);
      goto LAB_002aa09a;
    case 2:
      if (cVar3 == '\x12') {
        s = _internal_mutable_package_abi_cxx11_(this);
        goto LAB_002a9f42;
      }
      break;
    case 3:
      if (cVar3 == '\x1a') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          s_00 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Add(&this->dependency_);
          local_68 = internal::InlineGreedyStringParser(s_00,local_68,ctx);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '\x1a'));
        goto LAB_002a9d61;
      }
      break;
    case 4:
      if (cVar3 == '\"') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          msg_00 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&this->message_type_);
          local_68 = internal::ParseContext::ParseMessage<google::protobuf::DescriptorProto>
                               (ctx,msg_00,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '\"'));
        goto LAB_002a9d61;
      }
      break;
    case 5:
      if (cVar3 == '*') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          msg = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&this->enum_type_);
          local_68 = internal::ParseContext::ParseMessage<google::protobuf::EnumDescriptorProto>
                               (ctx,msg,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '*'));
        goto LAB_002a9d61;
      }
      break;
    case 6:
      if (cVar3 == '2') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          msg_02 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::Add(local_40);
          local_68 = internal::ParseContext::ParseMessage<google::protobuf::ServiceDescriptorProto>
                               (ctx,msg_02,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '2'));
        goto LAB_002a9d61;
      }
      break;
    case 7:
      if (cVar3 == ':') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          msg_03 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(local_38);
          local_68 = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                               (ctx,msg_03,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == ':'));
        goto LAB_002a9d61;
      }
      break;
    case 8:
      if (cVar3 == 'B') {
        msg_01 = _internal_mutable_options(this);
        local_68 = internal::ParseContext::ParseMessage<google::protobuf::FileOptions>
                             (ctx,msg_01,local_68);
        goto LAB_002aa09a;
      }
      break;
    case 9:
      if (cVar3 == 'J') {
        msg_04 = _internal_mutable_source_code_info(this);
        local_68 = internal::ParseContext::ParseMessage<google::protobuf::SourceCodeInfo>
                             (ctx,msg_04,local_68);
        goto LAB_002aa09a;
      }
      break;
    case 10:
      if (cVar3 == 'P') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          uVar2 = internal::ReadVarint(&local_68);
          _internal_add_public_dependency(this,(int32)uVar2);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == 'P'));
        goto LAB_002a9d61;
      }
      object = local_58;
      if ((local_5c & 0xff) == 0x52) {
LAB_002aa06f:
        local_68 = internal::PackedInt32Parser(object,local_68,ctx);
        goto LAB_002aa09a;
      }
      break;
    case 0xb:
      if (cVar3 == 'X') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          uVar2 = internal::ReadVarint(&local_68);
          _internal_add_weak_dependency(this,(int32)uVar2);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == 'X'));
        goto LAB_002a9d61;
      }
      object = local_50;
      if ((local_5c & 0xff) == 0x5a) goto LAB_002aa06f;
      break;
    case 0xc:
      if (cVar3 == 'b') {
        s = _internal_mutable_syntax_abi_cxx11_(this);
        goto LAB_002a9f42;
      }
    }
    if ((local_5c == 0) || ((local_5c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_5c - 1;
      return local_68;
    }
    local_68 = internal::UnknownFieldParse(local_5c,local_48,local_68,ctx);
LAB_002aa09a:
    if (local_68 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* FileDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.FileDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string package = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_package(), ptr, ctx, "google.protobuf.FileDescriptorProto.package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string dependency = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_dependency(), ptr, ctx, "google.protobuf.FileDescriptorProto.dependency");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_message_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_service(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<58>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FileOptions options = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ctx->ParseMessage(_internal_mutable_source_code_info(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 public_dependency = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          ptr -= 1;
          do {
            ptr += 1;
            _internal_add_public_dependency(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<80>(ptr));
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_public_dependency(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 weak_dependency = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 88)) {
          ptr -= 1;
          do {
            ptr += 1;
            _internal_add_weak_dependency(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<88>(ptr));
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_weak_dependency(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string syntax = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 98)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_syntax(), ptr, ctx, "google.protobuf.FileDescriptorProto.syntax");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}